

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
MethodClosure1<google::protobuf::(anonymous_namespace)::ClosureTest,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Run(MethodClosure1<google::protobuf::(anonymous_namespace)::ClosureTest,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this)

{
  long *plVar1;
  code *local_68;
  string local_38 [39];
  byte local_11;
  MethodClosure1<google::protobuf::(anonymous_namespace)::ClosureTest,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMStack_10;
  bool needs_delete;
  MethodClosure1<google::protobuf::(anonymous_namespace)::ClosureTest,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_11 = this->self_deleting_ & 1;
  local_68 = (code *)this->method_;
  plVar1 = (long *)((long)&(this->object_->super_Test)._vptr_Test + *(long *)&this->field_0x18);
  if (((ulong)local_68 & 1) != 0) {
    local_68 = *(code **)(local_68 + *plVar1 + -1);
  }
  pMStack_10 = this;
  std::__cxx11::string::string(local_38,(string *)&this->arg1_);
  (*local_68)(plVar1,local_38);
  std::__cxx11::string::~string(local_38);
  if (((local_11 & 1) != 0) &&
     (this != (MethodClosure1<google::protobuf::(anonymous_namespace)::ClosureTest,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0)) {
    (*(this->super_Closure)._vptr_Closure[1])();
  }
  return;
}

Assistant:

void Run() override {
    bool needs_delete = self_deleting_;  // read in case callback deletes
    (object_->*method_)(arg1_);
    if (needs_delete) delete this;
  }